

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int GetLabels(void *hPtr,char ***labels)

{
  undefined1 auVar1 [16];
  element_type *this;
  ulong uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 *in_RSI;
  Dictionary *in_RDI;
  size_type len;
  string label;
  int i;
  char **localLabels;
  int numLabels;
  shared_ptr<const_fasttext::Dictionary> dict;
  FastTextWrapper *fastText;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  string local_70 [36];
  int local_4c;
  undefined8 *local_48;
  int32_t local_2c;
  int32_t in_stack_ffffffffffffffe4;
  
  fasttext::FastText::getDictionary
            ((FastText *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  this = std::
         __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1efedb);
  local_2c = fasttext::Dictionary::nlabels(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_2c;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  uVar2 = -(ulong)((long)local_2c == 0) | uVar2;
  puVar3 = (undefined8 *)operator_new__(uVar2);
  *puVar3 = 0;
  memset(puVar3 + 1,0,uVar2 - 8);
  local_48 = puVar3;
  for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 1) {
    std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1eff78);
    fasttext::Dictionary::getLabel_abi_cxx11_(in_RDI,in_stack_ffffffffffffffe4);
    uVar2 = std::__cxx11::string::length();
    pvVar4 = operator_new__(uVar2 + 1);
    local_48[local_4c] = pvVar4;
    std::__cxx11::string::copy((char *)local_70,local_48[local_4c],uVar2);
    *(undefined1 *)(local_48[local_4c] + uVar2) = 0;
    std::__cxx11::string::~string(local_70);
  }
  *in_RSI = local_48;
  std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
            ((shared_ptr<const_fasttext::Dictionary> *)0x1f0064);
  return local_2c;
}

Assistant:

GetLabels(void* hPtr, char*** labels)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto dict = fastText->getDictionary();
    int numLabels = dict->nlabels();
    auto localLabels = new char*[numLabels] {nullptr};

    for (int i = 0; i < numLabels; ++i)
    {
        auto label = dict->getLabel(i);
        auto len = label.length();
        localLabels[i] = new char[len + 1];
        label.copy(localLabels[i], len);
        localLabels[i][len] = '\0';
    }

    *labels = localLabels;
    return numLabels;
}